

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall Expr_pi3_Test::TestBody(Expr_pi3_Test *this)

{
  ExprPtr *extraout_RDX;
  ExprPtr *extraout_RDX_00;
  ExprPtr *extraout_RDX_01;
  ExprPtr *ex;
  _func_int **message;
  double __x;
  AssertionResult gtest_ar;
  ExprPtr expr;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  AssertHelper local_40;
  string local_38;
  impl local_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  local_50 = (undefined1  [8])0x0;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi)->
  _M_string_length = 0x100000001;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi)->
  _M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00253718;
  local_50 = (undefined1  [8])
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi)
              ->field_2;
  *(undefined4 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi)->field_2 =
       2;
  *(undefined1 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)local_48._M_pi + 0x40))->_M_string_length = 0;
  mathiu::impl::operator/((impl *)&local_38,(ExprPtr *)&mathiu::impl::pi,(ExprPtr *)local_50);
  mathiu::impl::sin(local_18,__x);
  ex = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length);
    ex = extraout_RDX_00;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    ex = extraout_RDX_01;
  }
  mathiu::impl::toString_abi_cxx11_(&local_38,local_18,ex);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)local_50,"toString(expr)","\"1\"",&local_38,(char (*) [2])0x210345);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x20d5b4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_48._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x1f,(char *)message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi
                );
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Expr, pi3)
{
    auto expr = sin(pi / 2_i);
    EXPECT_EQ(toString(expr), "1");
}